

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O2

string * __thiscall
LexicalAnalyzer::categorize(string *__return_storage_ptr__,LexicalAnalyzer *this,string *word)

{
  bool bVar1;
  mapped_type *pmVar2;
  long lVar3;
  allocator local_99;
  regex pattern_id;
  regex pattern_num;
  regex pattern_del;
  regex pattern_op;
  
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->KEYWORD,word);
  if (*pmVar2 == true) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"keyword",(allocator *)&pattern_id);
  }
  else {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&pattern_id,"[_a-zA-Z]\\w{0,63}",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&pattern_op,"\\+|-|\\/|\\*|=|==|<|<=|>|>=|!=",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&pattern_del,"\\(|\\)|\\{|\\}|\\;|\\,",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&pattern_num,
               "[0-9]+|\\.[0-9]+|[Ee][+-]{0,1}[0-9]+|[0-9]+[Ee][+-]{0,1}[0-9]+|[0-9]+\\.[0-9]+([Ee][+-]{0,1}[0-9]+){0,1}"
               ,0x10);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (word,&pattern_id,0);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"identifier",&local_99);
    }
    else {
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (word,&pattern_op,0);
      if (bVar1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,"operator",&local_99);
      }
      else {
        bVar1 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          (word,&pattern_del,0);
        if (bVar1) {
          std::__cxx11::string::string((string *)__return_storage_ptr__,"delimiter",&local_99);
        }
        else {
          bVar1 = std::
                  regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                            (word,&pattern_num,0);
          if (bVar1) {
            lVar3 = std::__cxx11::string::find((char)word,0x2e);
            if (lVar3 == -1) {
              std::__cxx11::string::string((string *)__return_storage_ptr__,"int",&local_99);
            }
            else {
              std::__cxx11::string::string((string *)__return_storage_ptr__,"real",&local_99);
            }
          }
          else {
            std::__cxx11::string::string((string *)__return_storage_ptr__,"error",&local_99);
          }
        }
      }
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern_num);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern_del);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern_op);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern_id);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LexicalAnalyzer::categorize(std::string &word) {
    if (KEYWORD[word]) {//keyword
        return "keyword";
    }
    //identifier
    std::regex pattern_id("[_a-zA-Z]\\w{0,63}");
    std::regex pattern_op("\\+|-|\\/|\\*|=|==|<|<=|>|>=|!=");
    std::regex pattern_del("\\(|\\)|\\{|\\}|\\;|\\,");
    std::regex pattern_num(
            "[0-9]+|\\.[0-9]+|[Ee][+-]{0,1}[0-9]+|[0-9]+[Ee][+-]{0,1}[0-9]+|[0-9]+\\.[0-9]+([Ee][+-]{0,1}[0-9]+){0,1}");
    if (std::regex_match(word, pattern_id)) {
        return "identifier";
    }
    if (std::regex_match(word, pattern_op)) {
        return "operator";
    }
    if (std::regex_match(word, pattern_del)) {
        return "delimiter";
    }
    if (std::regex_match(word, pattern_num)) {
        if(word.find('.')!=std::string::npos)
            return "real";
        else
            return "int";
    }
    return "error";
}